

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  
  uVar3 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  uVar1 = (this->dx_).num_elts;
  if (uVar3 == uVar1) {
    if (uVar3 == 0) goto LAB_013fd4d5;
    pdVar4 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar3 == 0) {
      if (uVar1 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013fd4d5;
    }
    if (uVar1 != 0) {
      pdVar4 = (this->dx_).ptr_to_data;
      if (pdVar4 != (double *)0x0) {
        operator_delete__(pdVar4);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar3;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar5 = (ulong)uVar3 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar5);
    (this->dx_).ptr_to_data = pdVar4;
  }
  bVar2 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar2) {
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        vVar6 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar5);
        pdVar4[uVar5] = vVar6;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      vVar7 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
              ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar5);
      vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
              ::dx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar5);
      pdVar4[uVar5] = vVar8 + vVar7;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
LAB_013fd4d5:
  vVar7 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::val(&((fadexpr->fadexpr_).left_)->fadexpr_);
  vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
          ::val(&((fadexpr->fadexpr_).right_)->fadexpr_);
  this->val_ = vVar8 + vVar7;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}